

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O0

Interval * tcu::operator/(Interval *__return_storage_ptr__,Interval *nom,Interval *den)

{
  double dVar1;
  double dVar2;
  Interval *pIVar3;
  Interval **ppIVar4;
  double dVar5;
  double *pdVar6;
  undefined8 *puVar7;
  double *pdVar8;
  Interval *pIVar9;
  Interval *this;
  bool bVar10;
  deBool dVar11;
  float fVar12;
  Interval local_498;
  Interval local_480;
  Interval local_468;
  double local_450;
  double local_448;
  double local_440;
  Interval local_438;
  Interval *local_420;
  Interval *pIStack_418;
  Interval *local_410;
  Interval **local_408;
  Interval *point_7;
  double dStack_3f8;
  double local_3f0;
  double *local_3e8;
  Interval *point_6;
  Interval point_hi__3;
  Interval point_lo__3;
  Interval *point_dst__3;
  undefined8 *puStack_3a0;
  ScopedRoundingMode point_ctx__3;
  Interval *val_3;
  double denp_3;
  double local_388;
  double local_380;
  Interval *local_378;
  Interval *pIStack_370;
  Interval *local_368;
  Interval **local_360;
  Interval *point_5;
  double dStack_350;
  double local_348;
  double *local_340;
  Interval *point_4;
  Interval point_hi__2;
  Interval point_lo__2;
  Interval *point_dst__2;
  double *pdStack_2f8;
  ScopedRoundingMode point_ctx__2;
  Interval *val_2;
  double denp_2;
  double local_2e0;
  double local_2d8;
  undefined1 local_2d0 [8];
  Interval val_hi__1;
  Interval val_lo__1;
  Interval *val_dst__1;
  Interval *val_arg__1;
  Interval *tmp2__1;
  double nomp_1;
  double local_268 [3];
  Interval local_250;
  Interval *local_238;
  Interval *pIStack_230;
  Interval *local_228;
  Interval **local_220;
  Interval *point_3;
  double dStack_210;
  double local_208;
  double *local_200;
  Interval *point_2;
  Interval point_hi__1;
  Interval point_lo__1;
  Interval *point_dst__1;
  undefined8 *puStack_1b8;
  ScopedRoundingMode point_ctx__1;
  Interval *val_1;
  double denp_1;
  double local_1a0;
  double local_198;
  Interval *local_190;
  Interval *pIStack_188;
  Interval *local_180;
  Interval **local_178;
  Interval *point_1;
  double dStack_168;
  double local_160;
  undefined8 *local_158;
  Interval *point;
  Interval point_hi_;
  undefined1 auStack_128 [8];
  Interval point_lo_;
  Interval *point_dst_;
  double *pdStack_100;
  ScopedRoundingMode point_ctx_;
  Interval *val;
  double denp;
  undefined1 local_d8 [8];
  Interval val_hi_;
  Interval val_lo_;
  Interval *val_dst_;
  Interval *val_arg_;
  Interval *tmp2_;
  double nomp;
  double local_80;
  double local_78;
  double local_70;
  Interval tmp2__hi_;
  Interval tmp2__lo_;
  Interval *tmp2__dst_;
  Interval *tmp2__arg_;
  Interval *local_18;
  Interval *den_local;
  Interval *nom_local;
  
  local_18 = den;
  den_local = nom;
  Interval::Interval((Interval *)&tmp2__arg_,0.0);
  bVar10 = Interval::contains(den,(Interval *)&tmp2__arg_);
  if (bVar10) {
    Interval::unbounded(__return_storage_ptr__,false);
  }
  else {
    Interval::Interval(__return_storage_ptr__);
    do {
      this = den_local;
      Interval::Interval((Interval *)&tmp2__hi_.m_hi);
      Interval::Interval((Interval *)&local_70);
      bVar10 = Interval::empty(this);
      if (bVar10) {
        Interval::Interval((Interval *)&nomp);
        *(double *)__return_storage_ptr__ = nomp;
        __return_storage_ptr__->m_lo = local_80;
        __return_storage_ptr__->m_hi = local_78;
      }
      else {
        dVar1 = Interval::lo(this);
        do {
          pIVar9 = local_18;
          Interval::Interval((Interval *)&val_hi_.m_hi);
          Interval::Interval((Interval *)local_d8);
          bVar10 = Interval::empty(pIVar9);
          if (bVar10) {
            Interval::Interval((Interval *)&denp);
            tmp2__hi_.m_hi = denp;
          }
          else {
            dVar2 = Interval::lo(pIVar9);
            pdStack_100 = &val_hi_.m_hi;
            do {
              ScopedRoundingMode::ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst_ + 4));
              point_lo_.m_hi = (double)pdStack_100;
              Interval::Interval((Interval *)auStack_128);
              Interval::Interval((Interval *)&point);
              local_158 = (undefined8 *)auStack_128;
              deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
              Interval::Interval((Interval *)&point_1,dVar1 / dVar2);
              puVar7 = local_158;
              local_158[2] = local_160;
              dVar5 = dStack_168;
              *puVar7 = point_1;
              puVar7[1] = dVar5;
              local_178 = &point;
              deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
              Interval::Interval((Interval *)&local_190,dVar1 / dVar2);
              ppIVar4 = local_178;
              local_178[2] = local_180;
              pIVar3 = pIStack_188;
              *ppIVar4 = local_190;
              ppIVar4[1] = pIVar3;
              Interval::operator|((Interval *)&denp_1,(Interval *)auStack_128,(Interval *)&point);
              *(double *)point_lo_.m_hi = denp_1;
              *(double *)((long)point_lo_.m_hi + 8) = local_1a0;
              *(double *)((long)point_lo_.m_hi + 0x10) = local_198;
              ScopedRoundingMode::~ScopedRoundingMode((ScopedRoundingMode *)((long)&point_dst_ + 4))
              ;
              dVar11 = ::deGetFalse();
            } while (dVar11 != 0);
            dVar2 = Interval::hi(pIVar9);
            puStack_1b8 = (undefined8 *)local_d8;
            do {
              ScopedRoundingMode::ScopedRoundingMode
                        ((ScopedRoundingMode *)((long)&point_dst__1 + 4));
              puVar7 = puStack_1b8;
              Interval::Interval((Interval *)&point_hi__1.m_hi);
              Interval::Interval((Interval *)&point_2);
              local_200 = &point_hi__1.m_hi;
              deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
              Interval::Interval((Interval *)&point_3,dVar1 / dVar2);
              pdVar6 = local_200;
              local_200[2] = local_208;
              dVar5 = dStack_210;
              *pdVar6 = (double)point_3;
              pdVar6[1] = dVar5;
              local_220 = &point_2;
              deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
              Interval::Interval((Interval *)&local_238,dVar1 / dVar2);
              ppIVar4 = local_220;
              local_220[2] = local_228;
              pIVar3 = pIStack_230;
              *ppIVar4 = local_238;
              ppIVar4[1] = pIVar3;
              Interval::operator|(&local_250,(Interval *)&point_hi__1.m_hi,(Interval *)&point_2);
              *puVar7 = local_250._0_8_;
              puVar7[1] = local_250.m_lo;
              puVar7[2] = local_250.m_hi;
              ScopedRoundingMode::~ScopedRoundingMode
                        ((ScopedRoundingMode *)((long)&point_dst__1 + 4));
              dVar11 = ::deGetFalse();
            } while (dVar11 != 0);
            Interval::operator|((Interval *)local_268,(Interval *)&val_hi_.m_hi,(Interval *)local_d8
                               );
            tmp2__hi_.m_hi = local_268[0];
          }
          bVar10 = Interval::hasNaN(pIVar9);
          if (bVar10) {
            fVar12 = std::numeric_limits<float>::quiet_NaN();
            Interval::Interval((Interval *)&nomp_1,(double)fVar12);
            Interval::operator|=((Interval *)&tmp2__hi_.m_hi,(Interval *)&nomp_1);
          }
          dVar11 = ::deGetFalse();
        } while (dVar11 != 0);
        dVar1 = Interval::hi(this);
        do {
          pIVar9 = local_18;
          Interval::Interval((Interval *)&val_hi__1.m_hi);
          Interval::Interval((Interval *)local_2d0);
          bVar10 = Interval::empty(pIVar9);
          if (bVar10) {
            Interval::Interval((Interval *)&denp_2);
            local_70 = denp_2;
            tmp2__hi_._0_8_ = local_2e0;
            tmp2__hi_.m_lo = local_2d8;
          }
          else {
            dVar2 = Interval::lo(pIVar9);
            pdStack_2f8 = &val_hi__1.m_hi;
            do {
              ScopedRoundingMode::ScopedRoundingMode
                        ((ScopedRoundingMode *)((long)&point_dst__2 + 4));
              pdVar8 = pdStack_2f8;
              Interval::Interval((Interval *)&point_hi__2.m_hi);
              Interval::Interval((Interval *)&point_4);
              local_340 = &point_hi__2.m_hi;
              deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
              Interval::Interval((Interval *)&point_5,dVar1 / dVar2);
              pdVar6 = local_340;
              local_340[2] = local_348;
              dVar5 = dStack_350;
              *pdVar6 = (double)point_5;
              pdVar6[1] = dVar5;
              local_360 = &point_4;
              deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
              Interval::Interval((Interval *)&local_378,dVar1 / dVar2);
              ppIVar4 = local_360;
              local_360[2] = local_368;
              pIVar3 = pIStack_370;
              *ppIVar4 = local_378;
              ppIVar4[1] = pIVar3;
              Interval::operator|((Interval *)&denp_3,(Interval *)&point_hi__2.m_hi,
                                  (Interval *)&point_4);
              *pdVar8 = denp_3;
              pdVar8[1] = local_388;
              pdVar8[2] = local_380;
              ScopedRoundingMode::~ScopedRoundingMode
                        ((ScopedRoundingMode *)((long)&point_dst__2 + 4));
              dVar11 = ::deGetFalse();
            } while (dVar11 != 0);
            dVar2 = Interval::hi(pIVar9);
            puStack_3a0 = (undefined8 *)local_2d0;
            do {
              ScopedRoundingMode::ScopedRoundingMode
                        ((ScopedRoundingMode *)((long)&point_dst__3 + 4));
              puVar7 = puStack_3a0;
              Interval::Interval((Interval *)&point_hi__3.m_hi);
              Interval::Interval((Interval *)&point_6);
              local_3e8 = &point_hi__3.m_hi;
              deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
              Interval::Interval((Interval *)&point_7,dVar1 / dVar2);
              pdVar6 = local_3e8;
              local_3e8[2] = local_3f0;
              dVar5 = dStack_3f8;
              *pdVar6 = (double)point_7;
              pdVar6[1] = dVar5;
              local_408 = &point_6;
              deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
              Interval::Interval((Interval *)&local_420,dVar1 / dVar2);
              ppIVar4 = local_408;
              local_408[2] = local_410;
              pIVar3 = pIStack_418;
              *ppIVar4 = local_420;
              ppIVar4[1] = pIVar3;
              Interval::operator|(&local_438,(Interval *)&point_hi__3.m_hi,(Interval *)&point_6);
              *puVar7 = local_438._0_8_;
              puVar7[1] = local_438.m_lo;
              puVar7[2] = local_438.m_hi;
              ScopedRoundingMode::~ScopedRoundingMode
                        ((ScopedRoundingMode *)((long)&point_dst__3 + 4));
              dVar11 = ::deGetFalse();
            } while (dVar11 != 0);
            Interval::operator|((Interval *)&local_450,(Interval *)&val_hi__1.m_hi,
                                (Interval *)local_2d0);
            local_70 = local_450;
            tmp2__hi_._0_8_ = local_448;
            tmp2__hi_.m_lo = local_440;
          }
          bVar10 = Interval::hasNaN(pIVar9);
          if (bVar10) {
            fVar12 = std::numeric_limits<float>::quiet_NaN();
            Interval::Interval(&local_468,(double)fVar12);
            Interval::operator|=((Interval *)&local_70,&local_468);
          }
          dVar11 = ::deGetFalse();
        } while (dVar11 != 0);
        Interval::operator|(&local_480,(Interval *)&tmp2__hi_.m_hi,(Interval *)&local_70);
        __return_storage_ptr__->m_hasNaN = local_480.m_hasNaN;
        *(undefined7 *)&__return_storage_ptr__->field_0x1 = local_480._1_7_;
        __return_storage_ptr__->m_lo = local_480.m_lo;
        __return_storage_ptr__->m_hi = local_480.m_hi;
      }
      bVar10 = Interval::hasNaN(this);
      if (bVar10) {
        fVar12 = std::numeric_limits<float>::quiet_NaN();
        Interval::Interval(&local_498,(double)fVar12);
        Interval::operator|=(__return_storage_ptr__,&local_498);
      }
      dVar11 = ::deGetFalse();
    } while (dVar11 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval operator/ (const Interval& nom, const Interval& den)
{
	if (den.contains(0.0))
	{
		// \todo [2014-03-21 lauri] Non-inf endpoint when one den endpoint is
		// zero and nom doesn't cross zero?
		return Interval::unbounded();
	}
	else
	{
		Interval ret;

		TCU_INTERVAL_APPLY_MONOTONE2(ret, nomp, nom, denp, den, val,
									 TCU_SET_INTERVAL(val, point, point = nomp / denp));
		return ret;
	}
}